

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.cpp
# Opt level: O0

string * __thiscall
isotree::IsolationForest::to_sql
          (IsolationForest *this,bool output_tree_num,bool index1,size_t tree_num,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *numeric_colnames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *categ_colnames,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *categ_levels)

{
  reference pvVar1;
  byte in_CL;
  byte in_DL;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  undefined1 in_stack_000002a5;
  undefined1 in_stack_000002a6;
  undefined1 in_stack_000002a7;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_000002a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000002b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000002b8;
  ExtIsoForest *in_stack_000002c0;
  IsoForest *in_stack_000002c8;
  size_t in_stack_000002f8;
  int in_stack_00000300;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_stack_ffffffffffffff60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  byte local_1a;
  byte local_19;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_28 = in_R8;
  std::
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  ::empty((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           *)in_stack_ffffffffffffff60);
  std::
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ::empty(in_stack_ffffffffffffff60);
  generate_sql(in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,
               in_stack_000002a8,(bool)in_stack_000002a7,(bool)in_stack_000002a6,
               (bool)in_stack_000002a5,in_stack_000002f8,in_stack_00000300);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&local_48,0);
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_28);
  return in_RDI;
}

Assistant:

std::string IsolationForest::to_sql(bool output_tree_num, bool index1, size_t tree_num,
                                    const std::vector<std::string> &numeric_colnames,
                                    const std::vector<std::string> &categ_colnames,
                                    const std::vector<std::vector<std::string>> &categ_levels) const
{
    std::vector<std::string> out = generate_sql(
        (!this->model.trees.empty())? &this->model : nullptr,
        (!this->model_ext.hplanes.empty())? &this->model_ext : nullptr,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, true, tree_num,
        this->nthreads
    );
    return out[0];
}